

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>>
::
setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>::Construct>
          (Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>>
           *this,size_t count)

{
  ulong uVar1;
  undefined8 uVar2;
  FreeFunc *pFVar3;
  size_t sVar4;
  Hdr *pHVar5;
  RefCount *pRVar6;
  undefined8 *puVar7;
  long lVar8;
  Hdr *pHVar9;
  ulong uVar10;
  undefined8 *puVar11;
  bool bVar12;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>::Hdr>
  hdr;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>::Hdr>
  local_38;
  
  uVar10 = count * 0x18;
  lVar8 = *(long *)(this + 8);
  if ((lVar8 != 0) && (*(int *)(lVar8 + 0x10) == 1)) {
    uVar1 = *(ulong *)(this + 0x10);
    if (uVar1 == count) {
      return true;
    }
    if (uVar10 <= *(ulong *)(lVar8 + 0x18)) {
      if (uVar1 < count) {
        lVar8 = *(long *)this;
        for (puVar7 = (undefined8 *)(uVar1 * 0x18 + lVar8); puVar7 < (undefined8 *)(uVar10 + lVar8);
            puVar7 = puVar7 + 3) {
          *puVar7 = 0;
          puVar7[1] = 0;
          puVar7[2] = 0;
        }
        lVar8 = *(long *)(this + 8);
      }
      *(size_t *)(lVar8 + 0x28) = count;
      *(size_t *)(this + 0x10) = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
    ::release((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
               *)this);
  }
  else {
    if (*(long *)(this + 0x10) != 0) {
      sVar4 = getAllocSize<4096ul>(uVar10);
      pHVar5 = (Hdr *)mem::allocate(sVar4 + 0x30);
      (pHVar5->super_BufHdr).super_RefCount.m_refCount = 0;
      (pHVar5->super_BufHdr).super_RefCount.m_weakRefCount = 1;
      (pHVar5->super_BufHdr).m_bufferSize = sVar4;
      (pHVar5->super_BufHdr).m_flags = 0;
      (pHVar5->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Hdr_0014a110;
      (pHVar5->super_BufHdr).super_RefCount.m_freeFunc = mem::deallocate;
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>::Hdr>
      ::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>::Hdr>
                (&local_38,pHVar5);
      bVar12 = local_38.m_p != (Hdr *)0x0;
      if (bVar12) {
        (local_38.m_p)->m_count = count;
        pHVar5 = local_38.m_p + 1;
        puVar7 = *(undefined8 **)this;
        uVar10 = *(ulong *)(this + 0x10);
        if (uVar10 < count) {
          for (pHVar9 = pHVar5; pHVar9 < (Hdr *)(&(pHVar5->super_BufHdr).super_RefCount + uVar10);
              pHVar9 = (Hdr *)&(pHVar9->super_BufHdr).m_bufferSize) {
            uVar2 = puVar7[2];
            (pHVar9->super_BufHdr).super_RefCount.m_refCount = (int)uVar2;
            (pHVar9->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar2 >> 0x20);
            pFVar3 = (FreeFunc *)puVar7[1];
            (pHVar9->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar7;
            (pHVar9->super_BufHdr).super_RefCount.m_freeFunc = pFVar3;
            puVar7 = puVar7 + 3;
          }
          for (pRVar6 = &(pHVar5->super_BufHdr).super_RefCount + *(long *)(this + 0x10);
              pRVar6 < &(pHVar5->super_BufHdr).super_RefCount + count; pRVar6 = pRVar6 + 1) {
            pRVar6->_vptr_RefCount = (_func_int **)0x0;
            pRVar6->m_freeFunc = (FreeFunc *)0x0;
            pRVar6->m_refCount = 0;
            pRVar6->m_weakRefCount = 0;
          }
        }
        else {
          for (pHVar9 = pHVar5; pHVar9 < (Hdr *)(&(pHVar5->super_BufHdr).super_RefCount + count);
              pHVar9 = (Hdr *)&(pHVar9->super_BufHdr).m_bufferSize) {
            uVar2 = puVar7[2];
            (pHVar9->super_BufHdr).super_RefCount.m_refCount = (int)uVar2;
            (pHVar9->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar2 >> 0x20);
            pFVar3 = (FreeFunc *)puVar7[1];
            (pHVar9->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar7;
            (pHVar9->super_BufHdr).super_RefCount.m_freeFunc = pFVar3;
            puVar7 = puVar7 + 3;
          }
        }
        rc::RefCount::release(*(RefCount **)(this + 8));
        pHVar9 = local_38.m_p;
        *(Hdr **)this = pHVar5;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(Hdr **)(this + 8) = pHVar9;
        *(size_t *)(this + 0x10) = count;
      }
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>::Hdr>
      ::~Ptr(&local_38);
      return bVar12;
    }
    bVar12 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
             ::reserve((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
                        *)this,count);
    if (!bVar12) {
      return false;
    }
    puVar7 = *(undefined8 **)this;
    puVar11 = puVar7 + count * 3;
    for (; puVar7 < puVar11; puVar7 = puVar7 + 3) {
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
    }
    *(size_t *)(*(long *)(this + 8) + 0x28) = count;
    *(size_t *)(this + 0x10) = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}